

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

shared_ptr<ASTNode> __thiscall SchemeChar::to_AST(SchemeChar *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  shared_ptr<ASTNode> sVar2;
  undefined1 local_55;
  ast_type_t local_54;
  string local_50;
  string local_30;
  
  local_54 = CHAR;
  char_to_char_name_abi_cxx11_(&local_30,*(uchar *)(in_RSI + 8));
  normalize_char_name(&local_50,&local_30);
  (this->super_SchemeObject)._vptr_SchemeObject = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ASTNode,std::allocator<ASTNode>,ast_type_t,std::__cxx11::string>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->value,(ASTNode **)this,
             (allocator<ASTNode> *)&local_55,&local_54,&local_50);
  _Var1._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX_01;
  }
  sVar2.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ASTNode>)sVar2.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ASTNode> SchemeChar::to_AST() const
{
    return std::make_shared<ASTNode>(ast_type_t::CHAR, normalize_char_name(char_to_char_name(value)));
}